

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O3

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeDOFVariable
          (BerdyHelper *this,BerdyDynamicVariablesTypes dynamicVariableType,DOFIndex idx)

{
  int iVar1;
  int iVar2;
  TraversalIndex idx_00;
  IndexRange IVar3;
  
  if ((dynamicVariableType - DOF_TORQUE & 0xfffffffd) == 0) {
    if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
      iDynTree::Traversal::getChildLinkIndexFromJointIndex
                ((Model *)&this->m_dynamicsTraversal,(long)this);
      idx_00 = iDynTree::Traversal::getTraversalIndexFromLinkIndex((long)&this->m_dynamicsTraversal)
      ;
      IVar3 = getRangeOriginalBerdyFixedBase(this,dynamicVariableType,idx_00);
      return IVar3;
    }
    iVar1 = iDynTree::Model::getNrOfLinks();
    iVar2 = iDynTree::Model::getNrOfJoints();
    if (dynamicVariableType == DOF_ACCELERATION) {
      IVar3.size = 1;
      IVar3.offset = (iVar1 * 0xc + iVar2 * 6) + idx;
      return IVar3;
    }
  }
  IVar3 = (IndexRange)iDynTree::IndexRange::InvalidRange();
  return IVar3;
}

Assistant:

IndexRange BerdyHelper::getRangeDOFVariable(BerdyDynamicVariablesTypes dynamicVariableType, DOFIndex idx) const
{
    if( !isDOFBerdyDynamicVariable(dynamicVariableType) )
    {
        return IndexRange::InvalidRange();
    }

    if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
    {
        // For a model with all 1-dofs, dof index and joint index matches
        return getRangeOriginalBerdyFixedBase(dynamicVariableType,
                                              getTraversalIndexFromJointIndex(m_model, m_dynamicsTraversal, idx));
    }
    else
    {
        IndexRange ret;
        assert(m_options.berdyVariant == BERDY_FLOATING_BASE);
        assert(m_options.includeAllNetExternalWrenchesAsDynamicVariables);

        int totalSizeOfLinkVariables  = 12*m_model.getNrOfLinks();
        int totalSizeOfJointVariables = 6*m_model.getNrOfJoints();

        switch (dynamicVariableType)
        {
            case DOF_ACCELERATION:
                ret.offset = totalSizeOfLinkVariables + totalSizeOfJointVariables + idx;
                ret.size = 1;
                break;
            default:
                assert(false);
                ret = IndexRange::InvalidRange();
                break;
        }

        return ret;
    }
}